

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random.cpp
# Opt level: O0

ostream * rc::operator<<(ostream *os,Random *random)

{
  ostream *poVar1;
  array<unsigned_long,_4UL> *in_RSI;
  ostream *in_RDI;
  ostream *in_stack_ffffffffffffffe8;
  
  std::operator<<(in_RDI,"key=");
  show<std::array<unsigned_long,4ul>>(in_RSI,in_stack_ffffffffffffffe8);
  std::operator<<(in_RDI,", block=");
  show<std::array<unsigned_long,4ul>>(in_RSI,in_stack_ffffffffffffffe8);
  poVar1 = std::operator<<(in_RDI,", bits=");
  std::ostream::operator<<(poVar1,in_RSI[2]._M_elems[0]);
  poVar1 = std::operator<<(in_RDI,", counter=");
  std::ostream::operator<<(poVar1,in_RSI[2]._M_elems[1]);
  poVar1 = std::operator<<(in_RDI,", bitsi=");
  std::ostream::operator<<(poVar1,(uint)(byte)in_RSI[2]._M_elems[2]);
  return in_RDI;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Random &random) {
  os << "key=";
  show(random.m_key, os);
  os << ", block=";
  show(random.m_block, os);
  os << ", bits=" << random.m_bits;
  os << ", counter=" << random.m_counter;
  os << ", bitsi=" << static_cast<int>(random.m_bitsi);
  return os;
}